

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalQLParser.cpp
# Opt level: O1

void __thiscall cali::CalQLParser::CalQLParserImpl::parse_where(CalQLParserImpl *this,istream *is)

{
  char cVar1;
  Condition cond;
  Condition local_78;
  
  do {
    parse_filter_clause(&local_78,this,is);
    if ((this->error == false) && (local_78.op != None)) {
      (this->spec).filter.selection = List;
      std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::
      push_back(&(this->spec).filter.list,&local_78);
    }
    cVar1 = util::read_char(is);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.value._M_dataplus._M_p != &local_78.value.field_2) {
      operator_delete(local_78.value._M_dataplus._M_p,
                      local_78.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.attr_name._M_dataplus._M_p != &local_78.attr_name.field_2) {
      operator_delete(local_78.attr_name._M_dataplus._M_p,
                      local_78.attr_name.field_2._M_allocated_capacity + 1);
    }
  } while (((this->error == false) && (cVar1 == ',')) &&
          (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0));
  if (cVar1 != '\0') {
    std::istream::unget();
  }
  return;
}

Assistant:

void parse_where(std::istream& is)
    {
        char c = '\0';

        do {
            QuerySpec::Condition cond = parse_filter_clause(is);

            if (!error && cond.op != QuerySpec::Condition::None) {
                spec.filter.selection = QuerySpec::FilterSelection::List;
                spec.filter.list.push_back(cond);
            }

            c = util::read_char(is);
        } while (!error && is.good() && c == ',');

        if (c)
            is.unget();
    }